

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_astar.hpp
# Opt level: O3

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
external_astar::ExternalAstar<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          ExternalAstar<Tiles> *this,State *init)

{
  size_t *psVar1;
  pointer *ppSVar2;
  char cVar3;
  int iVar4;
  iterator iVar5;
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *pvVar9;
  int i;
  long lVar10;
  long lVar11;
  Tiles *pTVar12;
  long lVar13;
  State state;
  Node<Tiles> n;
  Node<Tiles> parent;
  State parent_state;
  State local_aa;
  Node<Tiles> local_98;
  ExternalAstarOpenList<Node<Tiles>_> *local_78;
  vector<Tiles::State,std::allocator<Tiles::State>> *local_70;
  Node<Tiles> local_68;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *local_50;
  State local_42;
  
  uVar8 = local_98._0_8_;
  lVar10 = 0;
  local_98.g = '\0';
  local_98.f = init->h;
  local_98._3_5_ = SUB85(uVar8,3);
  local_98.pop = -1;
  init->tiles[init->blank] = '\0';
  local_98.parent_packed.word = 0;
  do {
    local_98.parent_packed.word = (long)init->tiles[lVar10] | local_98.parent_packed.word << 4;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  local_78 = &this->open;
  local_98.packed.word = local_98.parent_packed.word;
  local_50 = __return_storage_ptr__;
  ExternalAstarOpenList<Node<Tiles>_>::push(local_78,&local_98);
  local_70 = (vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path;
LAB_0010b6e9:
  if ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ExternalAstarOpenList<Node<Tiles>_>::pop(&local_98,local_78);
    Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_aa,local_98.packed);
    if (local_aa.h != '\0') {
      psVar1 = &(this->super_SearchAlg<Tiles>).expd;
      *psVar1 = *psVar1 + 1;
      pTVar12 = (this->super_SearchAlg<Tiles>).dom;
      cVar6 = local_aa.blank;
      lVar10 = (long)local_aa.blank;
      if (0 < *(int *)(pTVar12 + lVar10 * 0x14 + 0x4440)) {
        lVar13 = 0;
        do {
          iVar4 = *(int *)(pTVar12 + lVar13 * 4 + lVar10 * 0x14 + 0x4444);
          if (iVar4 != local_98.pop) {
            psVar1 = &(this->super_SearchAlg<Tiles>).gend;
            *psVar1 = *psVar1 + 1;
            cVar7 = local_aa.h;
            cVar3 = local_aa.tiles[iVar4];
            local_aa.tiles[lVar10] = cVar3;
            local_aa.h = local_aa.h +
                         (char)pTVar12[(long)local_aa.blank * 4 +
                                       (long)cVar3 * 0x400 + (long)iVar4 * 0x40 + 0x440];
            local_aa.blank = (char)iVar4;
            local_68.g = local_98.g + '\x01';
            local_68.f = local_98.g + '\x01' + local_aa.h;
            local_68.pop = cVar6;
            local_aa.tiles[(char)iVar4] = '\0';
            lVar11 = 0;
            local_68.packed.word = 0;
            do {
              local_68.packed.word = (long)local_aa.tiles[lVar11] | local_68.packed.word << 4;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x10);
            local_68.parent_packed.word = local_98.packed.word;
            ExternalAstarOpenList<Node<Tiles>_>::push(local_78,&local_68);
            local_aa.h = cVar7;
            local_aa.tiles[local_aa.blank] = local_aa.tiles[lVar10];
            local_aa._16_2_ = CONCAT11(local_aa.h,cVar6);
            pTVar12 = (this->super_SearchAlg<Tiles>).dom;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(pTVar12 + lVar10 * 0x14 + 0x4440));
      }
      goto LAB_0010b6e9;
    }
    iVar5._M_current =
         (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Tiles::State,std::allocator<Tiles::State>>::_M_realloc_insert<Tiles::State_const&>
                (local_70,iVar5,&local_aa);
    }
    else {
      (iVar5._M_current)->blank = local_aa.blank;
      (iVar5._M_current)->h = local_aa.h;
      *(undefined8 *)(iVar5._M_current)->tiles = local_aa.tiles._0_8_;
      *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_aa.tiles._8_8_;
      ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar2 = *ppSVar2 + 1;
    }
    if (local_98.packed.word != local_98.parent_packed.word) {
      do {
        ExternalAstarOpenList<Node<Tiles>_>::trace_parent(&local_68,local_78,&local_98);
        Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_42,local_68.packed);
        iVar5._M_current =
             (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Tiles::State,std::allocator<Tiles::State>>::
          _M_realloc_insert<Tiles::State_const&>(local_70,iVar5,&local_42);
        }
        else {
          (iVar5._M_current)->blank = local_42.blank;
          (iVar5._M_current)->h = local_42.h;
          *(undefined8 *)(iVar5._M_current)->tiles = local_42.tiles._0_8_;
          *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_42.tiles._8_8_;
          ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppSVar2 = *ppSVar2 + 1;
        }
        local_98.packed.word = local_68.packed.word;
        local_98.g = local_68.g;
        local_98.f = local_68.f;
        local_98.pop = local_68.pop;
        local_98._3_5_ = local_68._3_5_;
        local_98.parent_packed.word = local_68.parent_packed.word;
      } while (local_68.packed.word != local_68.parent_packed.word);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
             *)local_78);
    rmdir("open_list_buckets");
  }
  pvVar9 = local_50;
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            (local_50,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)local_70);
  return pvVar9;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (path.size() == 0) {
                try {
                    Node<D> n = open.pop();

                    typename D::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<D> parent = open.trace_parent(n);
                            typename D::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        open.clear();
                        break;
                    }
                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<D> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                } catch (OpenListEmpty& e) {
                    break;
                } catch (...) {
                    throw;
                }
            }
            return path;
        }